

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  long *plVar1;
  http_connect_state *phVar2;
  Curl_easy *data;
  bool bVar3;
  _Bool _Var4;
  anon_enum_32 aVar5;
  CURLcode CVar6;
  int iVar7;
  CHUNKcode CVar8;
  http_connect_state *datap;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  timediff_t tVar12;
  long lVar13;
  char *pcVar14;
  size_t size;
  char *pcVar15;
  CURLcode CVar16;
  curl_socket_t sockfd;
  char *pcVar17;
  Curl_easy *pCVar18;
  char cVar19;
  Curl_send_buffer *req_buffer;
  curl_socket_t local_8c;
  uint local_88;
  int local_84;
  int *local_80;
  curl_off_t *local_78;
  int subversion;
  long local_68;
  Curl_easy *local_60;
  char *local_58;
  int *local_50;
  char *local_48;
  long *local_40;
  ssize_t local_38;
  
  datap = conn->connect_state;
  local_84 = sockindex;
  local_58 = hostname;
  if (datap == (http_connect_state *)0x0) {
    datap = (http_connect_state *)(*Curl_ccalloc)(1,0x4030);
    if (datap == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = datap;
    datap->tunnel_state = TUNNEL_INIT;
    datap->keepon = 1;
    datap->line_start = (char *)datap;
    datap->ptr = (char *)datap;
    datap->cl = 0;
    datap->close_connection = false;
  }
  subversion = 0;
  aVar5 = datap->tunnel_state;
  if (aVar5 != TUNNEL_COMPLETE) {
    pCVar18 = conn->data;
    local_68 = (long)local_84;
    sockfd = conn->sock[local_68];
    (conn->bits).proxy_connect_closed = false;
    local_40 = &(pCVar18->info).request_size;
    local_50 = &datap->perline;
    local_80 = &(pCVar18->req).httpcode;
    local_78 = &datap->cl;
    local_8c = sockfd;
LAB_004f21b0:
    pcVar9 = local_58;
    if (aVar5 == TUNNEL_INIT) {
      Curl_infof(pCVar18,"Establish HTTP proxy tunnel to %s:%d\n",local_58,(ulong)(uint)remote_port)
      ;
      (*Curl_cfree)((pCVar18->req).newurl);
      (pCVar18->req).newurl = (char *)0x0;
      req_buffer = Curl_add_buffer_init();
      if (req_buffer == (Curl_send_buffer *)0x0) {
LAB_004f2c0b:
        CVar6 = CURLE_OUT_OF_MEMORY;
      }
      else {
        local_88 = remote_port;
        pcVar9 = curl_maprintf("%s:%d",pcVar9,(ulong)(uint)remote_port);
        CVar16 = CURLE_OUT_OF_MEMORY;
        CVar6 = CVar16;
        if (pcVar9 != (char *)0x0) {
          CVar6 = Curl_http_output_auth(conn,"CONNECT",pcVar9,true);
          (*Curl_cfree)(pcVar9);
          pcVar9 = local_58;
          if (CVar6 == CURLE_OK) {
            pcVar17 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar17 = "1.0";
            }
            local_60 = pCVar18;
            if ((conn->host).name == local_58) {
              cVar19 = (conn->bits).ipv6_ip;
            }
            else {
              pcVar10 = strchr(local_58,0x3a);
              cVar19 = pcVar10 != (char *)0x0;
            }
            pcVar14 = "";
            pcVar10 = "";
            if (cVar19 != '\0') {
              pcVar10 = "[";
              pcVar14 = "]";
            }
            pcVar9 = curl_maprintf("%s%s%s:%d",pcVar10,pcVar9,pcVar14,(ulong)local_88);
            CVar6 = CVar16;
            if (pcVar9 != (char *)0x0) {
              pcVar10 = Curl_checkProxyheaders(conn,"Host");
              if (pcVar10 == (char *)0x0) {
                pcVar10 = curl_maprintf("Host: %s\r\n",pcVar9);
                if (pcVar10 == (char *)0x0) {
                  (*Curl_cfree)(pcVar9);
                  goto LAB_004f2c2c;
                }
              }
              else {
                pcVar10 = (char *)0x0;
              }
              local_48 = pcVar17;
              pcVar17 = Curl_checkProxyheaders(conn,"Proxy-Connection");
              pcVar14 = "";
              if (pcVar17 == (char *)0x0) {
                pcVar14 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar11 = Curl_checkProxyheaders(conn,"User-Agent");
              pcVar17 = "";
              if ((pcVar11 == (char *)0x0) &&
                 (pcVar17 = "", (local_60->set).str[0x26] != (char *)0x0)) {
                pcVar17 = (conn->allocptr).uagent;
              }
              pcVar11 = pcVar10;
              if (pcVar10 == (char *)0x0) {
                pcVar11 = "";
              }
              pcVar15 = (conn->allocptr).proxyuserpwd;
              if (pcVar15 == (char *)0x0) {
                pcVar15 = "";
              }
              CVar6 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar9,local_48,
                                       pcVar11,pcVar15,pcVar17,pcVar14);
              if (pcVar10 != (char *)0x0) {
                (*Curl_cfree)(pcVar10);
              }
              (*Curl_cfree)(pcVar9);
              pCVar18 = local_60;
              if (((CVar6 == CURLE_OK) &&
                  (CVar6 = Curl_add_custom_headers(conn,true,req_buffer), CVar6 == CURLE_OK)) &&
                 (CVar6 = Curl_add_bufferf(&req_buffer,"\r\n"), CVar6 == CURLE_OK)) {
                CVar6 = Curl_add_buffer_send(&req_buffer,conn,local_40,0,local_84);
                req_buffer = (Curl_send_buffer *)0x0;
                if (CVar6 == CURLE_OK) {
                  Curl_add_buffer_free(&req_buffer);
                  datap->tunnel_state = TUNNEL_CONNECT;
                  datap->perline = 0;
                  remote_port = local_88;
                  sockfd = local_8c;
                  goto LAB_004f245e;
                }
              }
              req_buffer = (Curl_send_buffer *)0x0;
              Curl_failf(pCVar18,"Failed sending CONNECT to proxy");
            }
          }
        }
LAB_004f2c2c:
        Curl_add_buffer_free(&req_buffer);
      }
      goto LAB_004f2c34;
    }
LAB_004f245e:
    tVar12 = Curl_timeleft(pCVar18,(curltime *)0x0,true);
    if (tVar12 < 1) {
      Curl_failf(pCVar18,"Proxy CONNECT aborted due to timeout");
      CVar6 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_004f2c34;
    }
    _Var4 = Curl_conn_data_pending(conn,local_84);
    if (!_Var4) goto LAB_004f213a;
LAB_004f248a:
    do {
      while( true ) {
        if (datap->keepon == 0) goto LAB_004f29d9;
        if (local_50 <= datap->ptr) {
          Curl_failf(pCVar18,"CONNECT response too large!");
          goto LAB_004f2abe;
        }
        CVar6 = Curl_read(conn,sockfd,datap->ptr,1,(ssize_t *)&req_buffer);
        if (CVar6 == CURLE_AGAIN) goto LAB_004f213a;
        iVar7 = Curl_pgrsUpdate(conn);
        if (iVar7 != 0) {
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_004f2c34;
        }
        if (CVar6 != CURLE_OK) {
          datap->keepon = 0;
          goto LAB_004f29d9;
        }
        if ((long)req_buffer < 1) {
          if (((pCVar18->set).proxyauth == 0) || ((pCVar18->state).authproxy.avail == 0)) {
            Curl_failf(pCVar18,"Proxy CONNECT aborted");
            bVar3 = true;
          }
          else {
            (conn->bits).proxy_connect_closed = true;
            bVar3 = false;
            Curl_infof(pCVar18,"Proxy CONNECT connection closed\n");
          }
          datap->keepon = 0;
          goto LAB_004f29db;
        }
        if (1 < datap->keepon) break;
        size = (long)datap->perline + 1;
        datap->perline = (int)size;
        if (*datap->ptr == '\n') {
          if ((pCVar18->set).verbose == true) {
            Curl_debug(pCVar18,CURLINFO_HEADER_IN,datap->line_start,size);
            size = (size_t)(uint)datap->perline;
          }
          iVar7 = (int)size;
          if ((pCVar18->set).suppress_connect_headers == false) {
            CVar6 = Curl_client_write(conn,(pCVar18->set).include_header | 2,datap->line_start,
                                      (long)iVar7);
            if (CVar6 != CURLE_OK) goto LAB_004f2c34;
            iVar7 = *local_50;
            sockfd = local_8c;
          }
          lVar13 = (long)iVar7;
          plVar1 = &(pCVar18->info).header_size;
          *plVar1 = *plVar1 + lVar13;
          plVar1 = &(pCVar18->req).headerbytecount;
          *plVar1 = *plVar1 + lVar13;
          cVar19 = *datap->line_start;
          if ((cVar19 == '\r') || (cVar19 == '\n')) {
            datap->ptr = datap->connect_buffer;
            if ((*local_80 == 0x197) && ((pCVar18->state).authproblem == false)) {
              datap->keepon = 2;
              if (datap->cl == 0) {
                if (datap->chunked_encoding != true) goto LAB_004f25f3;
                Curl_infof(pCVar18,"Ignore chunked response-body\n");
                (pCVar18->req).ignorebody = true;
                pcVar9 = datap->line_start;
                if (pcVar9[1] == '\n') {
                  pcVar9 = pcVar9 + 1;
                  datap->line_start = pcVar9;
                }
                CVar8 = Curl_httpchunk_read(conn,pcVar9 + 1,1,(ssize_t *)&req_buffer);
                if (CVar8 == CHUNKE_STOP) {
                  Curl_infof(pCVar18,"chunk reading DONE\n");
                  datap->keepon = 0;
                  datap->tunnel_state = TUNNEL_COMPLETE;
                }
              }
              else {
                Curl_infof(pCVar18,"Ignore %ld bytes of response-body\n");
              }
            }
            else {
LAB_004f25f3:
              datap->keepon = 0;
            }
            if (*local_78 == 0) {
LAB_004f2661:
              datap->tunnel_state = TUNNEL_COMPLETE;
            }
          }
          else {
            datap->line_start[lVar13] = '\0';
            iVar7 = curl_strnequal("WWW-Authenticate:",datap->line_start,0x11);
            if ((iVar7 == 0) || (*local_80 != 0x191)) {
              iVar7 = curl_strnequal("Proxy-authenticate:",datap->line_start,0x13);
              if ((iVar7 != 0) && (_Var4 = true, *local_80 == 0x197)) goto LAB_004f26d3;
              iVar7 = curl_strnequal("Content-Length:",datap->line_start,0xf);
              if (iVar7 == 0) {
                _Var4 = Curl_compareheader(datap->line_start,"Connection:","close");
                if (_Var4) {
LAB_004f283a:
                  datap->close_connection = true;
                }
                else {
                  iVar7 = curl_strnequal("Transfer-Encoding:",datap->line_start,0x12);
                  if (iVar7 == 0) {
                    _Var4 = Curl_compareheader(datap->line_start,"Proxy-Connection:","close");
                    if (_Var4) goto LAB_004f283a;
                    iVar7 = __isoc99_sscanf(datap->line_start,"HTTP/1.%d %d",&subversion,local_80);
                    if (iVar7 == 2) {
                      (pCVar18->info).httpproxycode = (pCVar18->req).httpcode;
                    }
                  }
                  else {
                    if (*local_80 - 200U < 100) {
                      pcVar9 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                      goto LAB_004f278a;
                    }
                    _Var4 = Curl_compareheader(datap->line_start,"Transfer-Encoding:","chunked");
                    if (_Var4) {
                      Curl_infof(pCVar18,"CONNECT responded chunked\n");
                      datap->chunked_encoding = true;
                      Curl_httpchunk_init(conn);
                    }
                  }
                }
              }
              else if (*local_80 - 200U < 100) {
                pcVar9 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_004f278a:
                Curl_infof(pCVar18,pcVar9);
              }
              else {
                curlx_strtoofft(datap->line_start + 0xf,(char **)0x0,10,local_78);
              }
            }
            else {
              _Var4 = false;
LAB_004f26d3:
              pcVar9 = Curl_copy_header_value(datap->line_start);
              if (pcVar9 == (char *)0x0) goto LAB_004f2c0b;
              CVar6 = Curl_http_input_auth(conn,_Var4,pcVar9);
              (*Curl_cfree)(pcVar9);
              if (CVar6 != CURLE_OK) goto LAB_004f2c34;
            }
            datap->perline = 0;
            datap->ptr = datap->connect_buffer;
            datap->line_start = datap->connect_buffer;
            sockfd = local_8c;
          }
        }
        else {
          datap->ptr = datap->ptr + 1;
        }
      }
      datap->ptr = datap->connect_buffer;
      lVar13 = datap->cl;
      if (lVar13 == 0) {
        local_38 = 0;
        CVar8 = Curl_httpchunk_read(conn,datap->connect_buffer,1,&local_38);
        if (CVar8 == CHUNKE_STOP) {
          Curl_infof(pCVar18,"chunk reading DONE\n");
          datap->keepon = 0;
          goto LAB_004f2661;
        }
        goto LAB_004f248a;
      }
      *local_78 = lVar13 + -1;
    } while (1 < lVar13);
    datap->keepon = 0;
    datap->tunnel_state = TUNNEL_COMPLETE;
LAB_004f29d9:
    bVar3 = false;
LAB_004f29db:
    iVar7 = Curl_pgrsUpdate(conn);
    if ((bVar3) || (iVar7 != 0)) {
      CVar6 = CURLE_RECV_ERROR;
      if (iVar7 != 0) {
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
      }
      goto LAB_004f2c34;
    }
    if (99 < (pCVar18->info).httpproxycode - 200U) {
      CVar6 = Curl_http_auth_act(conn);
      if (CVar6 != CURLE_OK) goto LAB_004f2c34;
      sockfd = local_8c;
      if ((conn->bits).close == true) {
        datap->close_connection = true;
      }
    }
    lVar13 = local_68;
    pcVar9 = (pCVar18->req).newurl;
    if (datap->close_connection != true) {
      if (pcVar9 == (char *)0x0) goto LAB_004f2b44;
      aVar5 = datap->tunnel_state;
      if (aVar5 == TUNNEL_COMPLETE) {
        phVar2 = conn->connect_state;
        phVar2->tunnel_state = TUNNEL_INIT;
        phVar2->keepon = 1;
        phVar2->line_start = phVar2->connect_buffer;
        phVar2->ptr = phVar2->connect_buffer;
        phVar2->cl = 0;
        phVar2->close_connection = false;
        aVar5 = datap->tunnel_state;
      }
      goto LAB_004f21b0;
    }
    if (pcVar9 != (char *)0x0) {
      Curl_closesocket(conn,conn->sock[local_68]);
      conn->sock[lVar13] = -1;
    }
LAB_004f2b44:
    if ((pCVar18->info).httpproxycode - 200U < 100) {
      datap->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (pCVar18->state).authproxy.done = true;
      Curl_infof(pCVar18,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(pCVar18->info).httpproxycode);
      (pCVar18->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
    }
    else {
      pcVar9 = (pCVar18->req).newurl;
      if ((pcVar9 != (char *)0x0 & datap->close_connection) == 1) {
        (conn->bits).proxy_connect_closed = true;
        Curl_infof(pCVar18,"Connect me again please\n");
        data = conn->data;
        conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
        Curl_infof(data,"CONNECT phase completed!\n");
      }
      else {
        (*Curl_cfree)(pcVar9);
        (pCVar18->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar13 = local_68;
        Curl_closesocket(conn,conn->sock[local_68]);
        conn->sock[lVar13] = -1;
      }
      datap->tunnel_state = TUNNEL_INIT;
      if ((conn->bits).proxy_connect_closed == false) {
        Curl_failf(pCVar18,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(pCVar18->req).httpcode);
LAB_004f2abe:
        CVar6 = CURLE_RECV_ERROR;
        goto LAB_004f2c34;
      }
    }
  }
LAB_004f213a:
  CVar6 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (CVar6 = CURLE_OK, conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_004f2c34:
  pCVar18 = conn->data;
  conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
  Curl_infof(pCVar18,"CONNECT phase completed!\n");
  return CVar6;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}